

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS
ref_node_bounding_sphere(REF_NODE ref_node,REF_INT *nodes,REF_INT n,REF_DBL *center,REF_DBL *radius)

{
  REF_DBL *pRVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  lVar3 = 0;
  do {
    while (center[lVar3] = 0.0, n < 1) {
      center[lVar3] = 0.0 / (double)n;
      lVar3 = lVar3 + 1;
      if (lVar3 == 3) {
        *radius = 0.0;
        return 0;
      }
    }
    pRVar1 = ref_node->real;
    dVar5 = 0.0;
    uVar2 = 0;
    do {
      dVar5 = dVar5 + pRVar1[(long)nodes[uVar2] * 0xf + (long)(int)lVar3];
      center[lVar3] = dVar5;
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
    center[lVar3] = dVar5 / (double)n;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  *radius = 0.0;
  if (n < 1) {
    return 0;
  }
  pRVar1 = ref_node->real;
  dVar5 = 0.0;
  uVar2 = 0;
  do {
    lVar3 = (long)nodes[uVar2];
    dVar4 = SQRT((pRVar1[lVar3 * 0xf + 2] - center[2]) * (pRVar1[lVar3 * 0xf + 2] - center[2]) +
                 (pRVar1[lVar3 * 0xf + 1] - center[1]) * (pRVar1[lVar3 * 0xf + 1] - center[1]) +
                 (pRVar1[lVar3 * 0xf] - *center) * (pRVar1[lVar3 * 0xf] - *center));
    if (dVar5 <= dVar4) {
      dVar5 = dVar4;
    }
    *radius = dVar5;
    uVar2 = uVar2 + 1;
  } while ((uint)n != uVar2);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_bounding_sphere(REF_NODE ref_node, REF_INT *nodes,
                                            REF_INT n, REF_DBL *center,
                                            REF_DBL *radius) {
  REF_INT i, j;
  for (i = 0; i < 3; i++) {
    center[i] = 0;
    for (j = 0; j < n; j++) {
      center[i] += ref_node_xyz(ref_node, i, nodes[j]);
    }
    center[i] /= (REF_DBL)n;
  }
  *radius = 0.0;
  for (i = 0; i < n; i++)
    *radius = MAX(
        *radius, sqrt(pow(ref_node_xyz(ref_node, 0, nodes[i]) - center[0], 2) +
                      pow(ref_node_xyz(ref_node, 1, nodes[i]) - center[1], 2) +
                      pow(ref_node_xyz(ref_node, 2, nodes[i]) - center[2], 2)));
  return REF_SUCCESS;
}